

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O0

int dice_evaluate(dice_t *dice,int level,aspect asp,random_value *v)

{
  random_value v_00;
  int iVar1;
  undefined1 local_30 [8];
  random_value rv;
  random_value *v_local;
  aspect asp_local;
  int level_local;
  dice_t *dice_local;
  
  rv._8_8_ = v;
  dice_random_value(dice,(random_value *)local_30);
  if (rv._8_8_ != 0) {
    *(undefined4 *)rv._8_8_ = local_30._0_4_;
    *(undefined4 *)(rv._8_8_ + 4) = local_30._4_4_;
    *(int *)(rv._8_8_ + 8) = rv.base;
    *(int *)(rv._8_8_ + 0xc) = rv.dice;
  }
  v_00.dice = local_30._4_4_;
  v_00.base = local_30._0_4_;
  v_00.sides = rv.base;
  v_00.m_bonus = rv.dice;
  iVar1 = randcalc(v_00,level,asp);
  return iVar1;
}

Assistant:

int dice_evaluate(const dice_t *dice, int level, aspect asp, random_value *v)
{
	random_value rv;
	dice_random_value(dice, &rv);

	if (v != NULL) {
		v->base = rv.base;
		v->dice = rv.dice;
		v->sides = rv.sides;
		v->m_bonus = rv.m_bonus;
	}

	return randcalc(rv, level, asp);
}